

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void SwpWrd(char *wrd,int siz)

{
  char cVar1;
  int i;
  char swp;
  int siz_local;
  char *wrd_local;
  
  for (i = 0; i < siz / 2; i = i + 1) {
    cVar1 = wrd[(siz - i) + -1];
    wrd[(siz - i) + -1] = wrd[i];
    wrd[i] = cVar1;
  }
  return;
}

Assistant:

static void SwpWrd(char *wrd, int siz)
{
   char  swp;
   int   i;

   for(i=0;i<siz/2;i++)
   {
      swp = wrd[ siz-i-1 ];
      wrd[ siz-i-1 ] = wrd[i];
      wrd[i] = swp;
   }
}